

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int archive_write_mtree_close(archive_write *a)

{
  att_counter_set *top;
  attr_counter **top_00;
  attr_counter **top_01;
  attr_counter **top_02;
  mtree_writer *mtree;
  int iVar1;
  mtree_entry_conflict *pmVar2;
  attr_counter *paVar3;
  uint uVar4;
  attr_counter *paVar5;
  mtree_entry_conflict *pmVar6;
  dir_info *pdVar7;
  mtree_entry_conflict *e;
  mtree_entry_conflict *local_48;
  att_counter_set *acs;
  
  mtree = (mtree_writer *)a->format_data;
  local_48 = mtree->root;
  if (local_48 != (mtree_entry_conflict *)0x0) {
    top = &mtree->acs;
    top_00 = &(mtree->acs).gid_list;
    top_01 = &(mtree->acs).mode_list;
    top_02 = &(mtree->acs).flags_list;
    do {
      if (mtree->output_global_set != 0) {
        attr_counter_set_free(mtree);
        pdVar7 = local_48->dir_info;
        pmVar2 = (mtree_entry_conflict *)0x0;
        uVar4 = 0;
        while (pmVar2 = (mtree_entry_conflict *)
                        __archive_rb_tree_iterate(&pdVar7->rbtree,&pmVar2->rbnode,uVar4),
              pmVar2 != (mtree_entry_conflict *)0x0) {
          uVar4 = mtree->keys;
          if ((uVar4 & 0x300000) != 0) {
            if (top->uid_list == (attr_counter *)0x0) {
              paVar3 = attr_counter_new(pmVar2,(attr_counter *)0x0);
              top->uid_list = paVar3;
              if (paVar3 == (attr_counter *)0x0) goto LAB_00372647;
            }
            else {
              paVar3 = (attr_counter *)0x0;
              paVar5 = top->uid_list;
              while ((paVar5 != (attr_counter *)0x0 && (paVar5->m_entry->uid != pmVar2->uid))) {
                paVar3 = paVar5;
                paVar5 = paVar5->next;
              }
              iVar1 = attr_counter_inc(&top->uid_list,paVar5,paVar3,pmVar2);
              if (iVar1 < 0) goto LAB_00372647;
            }
          }
          if ((uVar4 & 0x30) != 0) {
            if (*top_00 == (attr_counter *)0x0) {
              paVar3 = attr_counter_new(pmVar2,(attr_counter *)0x0);
              *top_00 = paVar3;
              if (paVar3 == (attr_counter *)0x0) goto LAB_00372647;
            }
            else {
              paVar3 = (attr_counter *)0x0;
              paVar5 = *top_00;
              while ((paVar5 != (attr_counter *)0x0 && (paVar5->m_entry->gid != pmVar2->gid))) {
                paVar3 = paVar5;
                paVar5 = paVar5->next;
              }
              iVar1 = attr_counter_inc(top_00,paVar5,paVar3,pmVar2);
              if (iVar1 < 0) goto LAB_00372647;
            }
          }
          if ((uVar4 >> 9 & 1) != 0) {
            if (*top_01 == (attr_counter *)0x0) {
              paVar3 = attr_counter_new(pmVar2,(attr_counter *)0x0);
              *top_01 = paVar3;
              if (paVar3 == (attr_counter *)0x0) goto LAB_00372647;
            }
            else {
              paVar3 = (attr_counter *)0x0;
              paVar5 = *top_01;
              while ((paVar5 != (attr_counter *)0x0 && (paVar5->m_entry->mode != pmVar2->mode))) {
                paVar3 = paVar5;
                paVar5 = paVar5->next;
              }
              iVar1 = attr_counter_inc(top_01,paVar5,paVar3,pmVar2);
              if (iVar1 < 0) goto LAB_00372647;
            }
          }
          if ((uVar4 & 8) != 0) {
            if (*top_02 == (attr_counter *)0x0) {
              paVar3 = attr_counter_new(pmVar2,(attr_counter *)0x0);
              *top_02 = paVar3;
              if (paVar3 == (attr_counter *)0x0) goto LAB_00372647;
            }
            else {
              paVar3 = (attr_counter *)0x0;
              paVar5 = *top_02;
              while ((paVar5 != (attr_counter *)0x0 &&
                     ((paVar5->m_entry->fflags_set != pmVar2->fflags_set ||
                      (paVar5->m_entry->fflags_clear != pmVar2->fflags_clear))))) {
                paVar3 = paVar5;
                paVar5 = paVar5->next;
              }
              iVar1 = attr_counter_inc(top_02,paVar5,paVar3,pmVar2);
              if (iVar1 < 0) {
LAB_00372647:
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
                return -0x1e;
              }
            }
          }
          pdVar7 = local_48->dir_info;
          uVar4 = 1;
        }
      }
      if ((local_48->dir_info->virtual == 0) || (mtree->classic != 0)) {
        iVar1 = write_mtree_entry(a,local_48);
        if (iVar1 != 0) {
          return -0x1e;
        }
      }
      else if (mtree->output_global_set != 0) {
        write_global(mtree);
      }
      mtree->depth = mtree->depth + 1;
      pdVar7 = local_48->dir_info;
      pmVar2 = (mtree_entry_conflict *)0x0;
      uVar4 = 0;
      while (pmVar2 = (mtree_entry_conflict *)
                      __archive_rb_tree_iterate(&pdVar7->rbtree,&pmVar2->rbnode,uVar4),
            pmVar2 != (mtree_entry_conflict *)0x0) {
        if (pmVar2->dir_info == (dir_info *)0x0) {
          iVar1 = write_mtree_entry(a,pmVar2);
          if (iVar1 != 0) {
            return -0x1e;
          }
          pdVar7 = local_48->dir_info;
        }
        else {
          pmVar2->dir_info->chnext = (mtree_entry_conflict *)0x0;
          *(local_48->dir_info->children).last = pmVar2;
          pdVar7 = local_48->dir_info;
          (pdVar7->children).last = &pmVar2->dir_info->chnext;
        }
        uVar4 = 1;
      }
      iVar1 = mtree->depth;
      mtree->depth = iVar1 + -1;
      pmVar2 = (local_48->dir_info->children).first;
      if (pmVar2 == (mtree_entry_conflict *)0x0) {
        if ((mtree->classic != 0) && (iVar1 = write_dot_dot_entry(a,local_48), iVar1 != 0)) {
          return -0x1e;
        }
        while ((pmVar6 = local_48, pmVar2 = pmVar6->parent, local_48 = pmVar6, pmVar6 != pmVar2 &&
               (local_48 = pmVar6->dir_info->chnext, local_48 == (mtree_entry_conflict *)0x0))) {
          if (mtree->indent != 0) {
            mtree->depth = mtree->depth + -1;
          }
          local_48 = pmVar2;
          if (mtree->classic != 0) {
            iVar1 = write_dot_dot_entry(a,pmVar2);
            if (iVar1 != 0) {
              return -0x1e;
            }
            local_48 = pmVar6->parent;
          }
        }
      }
      else {
        local_48 = pmVar2;
        if (mtree->indent != 0) {
          mtree->depth = iVar1;
        }
      }
    } while (local_48 != local_48->parent);
  }
  archive_write_set_bytes_in_last_block(&a->archive,1);
  iVar1 = __archive_write_output(a,(mtree->buf).s,(mtree->buf).length);
  return iVar1;
}

Assistant:

static int
archive_write_mtree_close(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;
	int ret;

	if (mtree->root != NULL) {
		ret = write_mtree_entry_tree(a);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	archive_write_set_bytes_in_last_block(&a->archive, 1);

	return __archive_write_output(a, mtree->buf.s, mtree->buf.length);
}